

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.c
# Opt level: O3

int asn1_write_tagged_int(uchar **p,uchar *start,int val,int tag)

{
  uchar *puVar1;
  size_t sVar2;
  int iVar3;
  int iVar4;
  size_t len;
  
  sVar2 = 1;
  do {
    len = sVar2;
    puVar1 = *p;
    if (puVar1 == start || (long)puVar1 - (long)start < 0) {
      return -0x6c;
    }
    *p = puVar1 + -1;
    puVar1[-1] = (uchar)val;
    val = val >> 8;
    sVar2 = len + 1;
  } while (0 < val);
  puVar1 = *p;
  if ((char)*puVar1 < '\0') {
    if (puVar1 == start || (long)puVar1 - (long)start < 0) {
      return -0x6c;
    }
    *p = puVar1 + -1;
    puVar1[-1] = '\0';
    len = len + 1;
  }
  iVar3 = mbedtls_asn1_write_len(p,start,len);
  iVar4 = iVar3;
  if ((-1 < iVar3) &&
     (puVar1 = *p, iVar4 = -0x6c, puVar1 != start && -1 < (long)puVar1 - (long)start)) {
    *p = puVar1 + -1;
    puVar1[-1] = (uchar)tag;
    iVar4 = (int)len + iVar3 + 1;
  }
  return iVar4;
}

Assistant:

static int asn1_write_tagged_int( unsigned char **p, unsigned char *start, int val, int tag )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len = 0;

    do
    {
        if( *p - start < 1 )
            return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );
        len += 1;
        *--(*p) = val & 0xff;
        val >>= 8;
    }
    while( val > 0 );

    if( **p & 0x80 )
    {
        if( *p - start < 1 )
            return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );
        *--(*p) = 0x00;
        len += 1;
    }

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( p, start, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( p, start, tag ) );

    return( (int) len );
}